

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

uchar * stbi__load_and_postprocess_8bit(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  uchar *__ptr;
  uchar *puVar1;
  ulong uVar2;
  int iVar3;
  int *piVar4;
  uint uVar5;
  ulong uVar6;
  long *in_FS_OFFSET;
  stbi__result_info ri;
  stbi__result_info local_3c;
  
  __ptr = (uchar *)stbi__load_main(s,x,y,comp,req_comp,&local_3c,8);
  if (__ptr == (uchar *)0x0) {
    __ptr = (uchar *)0x0;
  }
  else {
    if (local_3c.bits_per_channel != 8) {
      iVar3 = req_comp;
      if (req_comp == 0) {
        iVar3 = *comp;
      }
      uVar5 = *y * *x * iVar3;
      puVar1 = (uchar *)malloc((long)(int)uVar5);
      if (puVar1 == (uchar *)0x0) {
        *(char **)(*in_FS_OFFSET + -0x20) = "outofmem";
      }
      else {
        uVar2 = 0;
        uVar6 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          uVar6 = uVar2;
        }
        for (; uVar6 != uVar2; uVar2 = uVar2 + 1) {
          puVar1[uVar2] = __ptr[uVar2 * 2 + 1];
        }
        free(__ptr);
      }
      local_3c.bits_per_channel = 8;
      __ptr = puVar1;
    }
    piVar4 = &stbi__vertically_flip_on_load_global;
    if (*(int *)(*in_FS_OFFSET + -0x14) != 0) {
      piVar4 = (int *)(*in_FS_OFFSET + -0x18);
    }
    if (*piVar4 != 0) {
      if (req_comp == 0) {
        req_comp = *comp;
      }
      stbi__vertical_flip(__ptr,*x,*y,req_comp);
    }
  }
  return __ptr;
}

Assistant:

static unsigned char *stbi__load_and_postprocess_8bit(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   stbi__result_info ri;
   void *result = stbi__load_main(s, x, y, comp, req_comp, &ri, 8);

   if (result == NULL)
      return NULL;

   // it is the responsibility of the loaders to make sure we get either 8 or 16 bit.
   STBI_ASSERT(ri.bits_per_channel == 8 || ri.bits_per_channel == 16);

   if (ri.bits_per_channel != 8) {
      result = stbi__convert_16_to_8((stbi__uint16 *) result, *x, *y, req_comp == 0 ? *comp : req_comp);
      ri.bits_per_channel = 8;
   }

   // @TODO: move stbi__convert_format to here

   if (stbi__vertically_flip_on_load) {
      int channels = req_comp ? req_comp : *comp;
      stbi__vertical_flip(result, *x, *y, channels * sizeof(stbi_uc));
   }

   return (unsigned char *) result;
}